

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O1

void zzNegMod(word *b,word *a,word *mod,size_t n)

{
  bool_t bVar1;
  
  zzSub(b,mod,a,n);
  bVar1 = wwEq(b,mod,n);
  zzSubAndW(b,mod,n,-(long)bVar1);
  return;
}

Assistant:

void SAFE(zzNegMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word mask;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0);
	// b <- mod - a
	zzSub(b, mod, a, n);
	// mask <- b == mod ? WORD_MAX : WORD_0
	mask = WORD_0 - (word)wwEq(b, mod, n);
	// b <- b - mod & mask
	zzSubAndW(b, mod, n, mask);
	mask = 0;
}